

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_0::NetworkAddressImpl::connect
          (NetworkAddressImpl *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  size_t sVar1;
  PromiseArena *pPVar2;
  SocketAddress *node;
  ArrayDisposer *pAVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  long lVar5;
  TransformPromiseNodeBase *this_00;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs;
  Promise<kj::AuthenticatedStream> promise;
  Array<kj::(anonymous_namespace)::SocketAddress> addrsCopy;
  Array<kj::(anonymous_namespace)::SocketAddress> local_58;
  size_t sStack_40;
  undefined8 *local_38;
  
  lVar5 = CONCAT44(in_register_00000034,__fd);
  pvVar4 = *(void **)(lVar5 + 0x18);
  sVar1 = *(size_t *)(lVar5 + 0x20);
  local_58.disposer =
       (ArrayDisposer *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x88,0,sVar1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  if (sVar1 != 0) {
    memcpy(local_58.disposer,pvVar4,sVar1 * 0x88);
  }
  local_38 = &kj::_::HeapArrayDisposer::instance;
  addrs.size_ = (size_t)local_58.disposer;
  addrs.ptr = *(SocketAddress **)(lVar5 + 0x10);
  sStack_40 = sVar1;
  connectImpl((LowLevelAsyncIoProvider *)&local_58,*(NetworkFilter **)(lVar5 + 8),addrs,
              SUB81(sVar1,0));
  Promise<kj::AuthenticatedStream>::attach<kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((Promise<kj::AuthenticatedStream> *)&local_58.size_,&local_58);
  sVar1 = local_58.size_;
  pPVar2 = *(PromiseArena **)(local_58.size_ + 8);
  if (pPVar2 == (PromiseArena *)0x0 || local_58.size_ - (long)pPVar2 < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_58.size_,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1557:15)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00649b90;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(PromiseArena **)(local_58.size_ + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)(local_58.size_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_58.size_,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1557:15)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(sVar1 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00649b90;
    ((PromiseArenaMember *)(sVar1 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  sVar1 = local_58.size_;
  (this->super_NetworkAddress)._vptr_NetworkAddress = (_func_int **)this_00;
  if ((PromiseArenaMember *)local_58.size_ != (PromiseArenaMember *)0x0) {
    local_58.size_ = 0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)sVar1);
  }
  node = local_58.ptr;
  if (local_58.ptr != (SocketAddress *)0x0) {
    local_58.ptr = (SocketAddress *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  sVar1 = sStack_40;
  pAVar3 = local_58.disposer;
  if (local_58.disposer != (ArrayDisposer *)0x0) {
    local_58.disposer = (ArrayDisposer *)0x0;
    sStack_40 = 0;
    (**(code **)*local_38)(local_38,pAVar3,0x88,sVar1,sVar1,0);
  }
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> connect() override {
    auto addrsCopy = heapArray(addrs.asPtr());
    auto promise = connectImpl(lowLevel, filter, addrsCopy, false);
    return promise.attach(kj::mv(addrsCopy))
        .then([](AuthenticatedStream&& a) { return kj::mv(a.stream); });
  }